

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeTest_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  long lVar1;
  Fts5IndexIter *pIter_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  Fts5ExprTerm *pTerm_00;
  Fts5ExprPhrase *pFVar5;
  bool local_71;
  Fts5IndexIter *pIter;
  i64 iRowid;
  Fts5ExprTerm *pTerm;
  Fts5ExprPhrase *pPhrase;
  int bDesc;
  int bMatch;
  int j;
  int i;
  i64 iLast;
  Fts5ExprPhrase *pFStack_30;
  int rc;
  Fts5ExprPhrase *pLeft;
  Fts5ExprNearset *pNear;
  Fts5ExprNode *pNode_local;
  Fts5Expr *pExpr_local;
  
  pLeft = (Fts5ExprPhrase *)pNode->pNear;
  pFStack_30 = *(Fts5ExprPhrase **)&pLeft->nTerm;
  iLast._4_4_ = 0;
  iVar4 = pExpr->bDesc;
  pNear = (Fts5ExprNearset *)pNode;
  pNode_local = (Fts5ExprNode *)pExpr;
  if (pFStack_30->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    _j = (Fts5ExprPhrase *)(pFStack_30->aTerm[0].pIter)->iRowid;
  }
  else {
    _j = (Fts5ExprPhrase *)fts5ExprSynonymRowid(pFStack_30->aTerm,iVar4,(int *)0x0);
  }
  do {
    bVar2 = true;
    for (bMatch = 0; bMatch < (pLeft->poslist).n; bMatch = bMatch + 1) {
      lVar1 = *(long *)((long)pLeft->aTerm + (long)bMatch * 8 + -8);
      for (bDesc = 0; bDesc < *(int *)(lVar1 + 0x18); bDesc = bDesc + 1) {
        pTerm_00 = (Fts5ExprTerm *)(lVar1 + 0x20 + (long)bDesc * 0x20);
        if (pTerm_00->pSynonym == (Fts5ExprTerm *)0x0) {
          pIter_00 = *(Fts5IndexIter **)(lVar1 + (long)bDesc * 0x20 + 0x30);
          if (((Fts5ExprPhrase *)pIter_00->iRowid != _j) && (pIter_00->bEof == '\0')) {
            iVar3 = fts5ExprAdvanceto(pIter_00,iVar4,(i64 *)&j,(int *)((long)&iLast + 4),
                                      (int *)&pNear->field_0x4);
            if (iVar3 != 0) {
              return iLast._4_4_;
            }
            goto LAB_001dca06;
          }
        }
        else {
          pFVar5 = (Fts5ExprPhrase *)fts5ExprSynonymRowid(pTerm_00,iVar4,(int *)0x0);
          if (pFVar5 != _j) {
            iVar3 = fts5ExprSynonymAdvanceto(pTerm_00,iVar4,(i64 *)&j,(int *)((long)&iLast + 4));
            if (iVar3 != 0) {
              *(undefined4 *)&pNear->pColset = 0;
              *(undefined4 *)&pNear->field_0x4 = 1;
              return iLast._4_4_;
            }
LAB_001dca06:
            bVar2 = false;
          }
        }
      }
    }
    if (bVar2) {
      pNear->apPhrase[0] = _j;
      iVar4 = fts5ExprNearTest((int *)((long)&iLast + 4),(Fts5Expr *)pNode_local,
                               (Fts5ExprNode *)pNear);
      local_71 = iVar4 == 0 && iLast._4_4_ == 0;
      *(uint *)&pNear->pColset = (uint)local_71;
      return iLast._4_4_;
    }
  } while( true );
}

Assistant:

static int fts5ExprNodeTest_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode
){
  Fts5ExprNearset *pNear = pNode->pNear;
  Fts5ExprPhrase *pLeft = pNear->apPhrase[0];
  int rc = SQLITE_OK;
  i64 iLast;                      /* Lastest rowid any iterator points to */
  int i, j;                       /* Phrase and token index, respectively */
  int bMatch;                     /* True if all terms are at the same rowid */
  const int bDesc = pExpr->bDesc;

  /* Check that this node should not be FTS5_TERM */
  assert( pNear->nPhrase>1 
       || pNear->apPhrase[0]->nTerm>1 
       || pNear->apPhrase[0]->aTerm[0].pSynonym
       || pNear->apPhrase[0]->aTerm[0].bFirst
  );

  /* Initialize iLast, the "lastest" rowid any iterator points to. If the
  ** iterator skips through rowids in the default ascending order, this means
  ** the maximum rowid. Or, if the iterator is "ORDER BY rowid DESC", then it
  ** means the minimum rowid.  */
  if( pLeft->aTerm[0].pSynonym ){
    iLast = fts5ExprSynonymRowid(&pLeft->aTerm[0], bDesc, 0);
  }else{
    iLast = pLeft->aTerm[0].pIter->iRowid;
  }

  do {
    bMatch = 1;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      for(j=0; j<pPhrase->nTerm; j++){
        Fts5ExprTerm *pTerm = &pPhrase->aTerm[j];
        if( pTerm->pSynonym ){
          i64 iRowid = fts5ExprSynonymRowid(pTerm, bDesc, 0);
          if( iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprSynonymAdvanceto(pTerm, bDesc, &iLast, &rc) ){
            pNode->bNomatch = 0;
            pNode->bEof = 1;
            return rc;
          }
        }else{
          Fts5IndexIter *pIter = pPhrase->aTerm[j].pIter;
          if( pIter->iRowid==iLast || pIter->bEof ) continue;
          bMatch = 0;
          if( fts5ExprAdvanceto(pIter, bDesc, &iLast, &rc, &pNode->bEof) ){
            return rc;
          }
        }
      }
    }
  }while( bMatch==0 );

  pNode->iRowid = iLast;
  pNode->bNomatch = ((0==fts5ExprNearTest(&rc, pExpr, pNode)) && rc==SQLITE_OK);
  assert( pNode->bEof==0 || pNode->bNomatch==0 );

  return rc;
}